

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlSetUniformMatrices(int locIndex,Matrix *matrices,int count)

{
  (*glad_glUniformMatrix4fv)(locIndex,count,'\x01',&matrices->m0);
  return;
}

Assistant:

void rlSetUniformMatrices(int locIndex, const Matrix *matrices, int count)
{
#if defined(GRAPHICS_API_OPENGL_33)
    glUniformMatrix4fv(locIndex, count, true, (const float *)matrices);
#elif defined(GRAPHICS_API_OPENGL_ES2)
    // WARNING: WebGL does not support Matrix transpose ("true" parameter)
    // REF: https://developer.mozilla.org/en-US/docs/Web/API/WebGLRenderingContext/uniformMatrix
    glUniformMatrix4fv(locIndex, count, false, (const float *)matrices);
#endif
}